

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  undefined4 in_ECX;
  FieldDescriptor *in_RDX;
  Reflection *in_RSI;
  Reflection *in_RDI;
  EnumValueDescriptor *value_desc;
  char *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_00000068;
  CppType in_stack_0000006c;
  Descriptor *in_stack_00000070;
  FieldDescriptor *in_stack_00000078;
  Descriptor *in_stack_00000080;
  Message *in_stack_ffffffffffffffc8;
  EnumValueDescriptor *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x408c4e);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000080,in_stack_00000078,(char *)in_stack_00000070,in_stack_0000006c);
  }
  Descriptor::file(in_RDI->descriptor_);
  bVar1 = anon_unknown_0::CreateUnknownEnumValues((FileDescriptor *)0x408c86);
  if (!bVar1) {
    FieldDescriptor::enum_type((FieldDescriptor *)in_RDI);
    in_stack_ffffffffffffffd8 =
         EnumDescriptor::FindValueByNumber
                   ((EnumDescriptor *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    if (in_stack_ffffffffffffffd8 == (EnumValueDescriptor *)0x0) {
      MutableUnknownFields(in_RDI,in_stack_ffffffffffffffc8);
      FieldDescriptor::number(in_RDX);
      UnknownFieldSet::AddVarint
                ((UnknownFieldSet *)in_RSI,(int)((ulong)in_RDX >> 0x20),
                 CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
      return;
    }
  }
  SetEnumValueInternal
            (in_RSI,(Message *)in_RDX,(FieldDescriptor *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  return;
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(descriptor_->file())) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}